

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderErrorCode
DecodeVarLenUint8(BrotliDecoderStateInternal *s,BrotliBitReader *br,uint32_t *value)

{
  BrotliRunningDecodeUint8State BVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint32_t uVar5;
  int iVar6;
  
  BVar1 = s->substate_decode_uint8;
  if (BVar1 == BROTLI_STATE_DECODE_UINT8_NONE) {
    uVar4 = (ulong)br->bit_pos_;
    while ((int)uVar4 == 0x40) {
      if (br->avail_in == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar4 = br->val_;
      br->val_ = uVar4 >> 8;
      br->val_ = (ulong)*br->next_in << 0x38 | uVar4 >> 8;
      br->bit_pos_ = 0x38;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
      uVar4 = 0x38;
    }
    uVar5 = (int)uVar4 + 1;
    br->bit_pos_ = uVar5;
    if ((br->val_ >> (uVar4 & 0x3f) & 1) == 0) {
      *value = 0;
      return BROTLI_DECODER_SUCCESS;
    }
  }
  else {
    if (BVar1 != BROTLI_STATE_DECODE_UINT8_SHORT) {
      if (BVar1 != BROTLI_STATE_DECODE_UINT8_LONG) {
        return BROTLI_DECODER_ERROR_UNREACHABLE;
      }
      uVar5 = *value;
      goto LAB_00102d9a;
    }
    uVar5 = br->bit_pos_;
  }
  for (uVar5 = uVar5 + 3; uVar5 - 0x41 < 3; uVar5 = uVar5 - 8) {
    if (br->avail_in == 0) {
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    uVar4 = br->val_;
    br->val_ = uVar4 >> 8;
    br->val_ = (ulong)*br->next_in << 0x38 | uVar4 >> 8;
    br->bit_pos_ = uVar5 - 0xb;
    br->avail_in = br->avail_in - 1;
    br->next_in = br->next_in + 1;
  }
  uVar4 = br->val_ >> ((char)uVar5 - 3U & 0x3f);
  br->bit_pos_ = uVar5;
  uVar5 = (uint)uVar4 & 7;
  if ((uVar4 & 7) == 0) {
    *value = 1;
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
    return BROTLI_DECODER_SUCCESS;
  }
  *value = uVar5;
LAB_00102d9a:
  uVar3 = br->bit_pos_;
  iVar6 = -uVar3;
  while( true ) {
    uVar3 = uVar3 - 8;
    if (uVar5 <= iVar6 + 0x40U) {
      uVar2 = kBitMask[uVar5];
      br->bit_pos_ = uVar5 - iVar6;
      *value = (1 << ((byte)*value & 0x1f)) + ((uint)(br->val_ >> (-(char)iVar6 & 0x3fU)) & uVar2);
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
      return BROTLI_DECODER_SUCCESS;
    }
    if (br->avail_in == 0) break;
    uVar4 = br->val_;
    br->val_ = uVar4 >> 8;
    br->val_ = (ulong)*br->next_in << 0x38 | uVar4 >> 8;
    br->bit_pos_ = uVar3;
    br->avail_in = br->avail_in - 1;
    br->next_in = br->next_in + 1;
    iVar6 = iVar6 + 8;
  }
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
  return BROTLI_DECODER_NEEDS_MORE_INPUT;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderErrorCode DecodeVarLenUint8(
    BrotliDecoderState* s, BrotliBitReader* br, uint32_t* value) {
  uint32_t bits;
  switch (s->substate_decode_uint8) {
    case BROTLI_STATE_DECODE_UINT8_NONE:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 1, &bits))) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits == 0) {
        *value = 0;
        return BROTLI_DECODER_SUCCESS;
      }
    /* Fall through. */

    case BROTLI_STATE_DECODE_UINT8_SHORT:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 3, &bits))) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits == 0) {
        *value = 1;
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
        return BROTLI_DECODER_SUCCESS;
      }
      /* Use output value as a temporary storage. It MUST be persisted. */
      *value = bits;
    /* Fall through. */

    case BROTLI_STATE_DECODE_UINT8_LONG:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, *value, &bits))) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      *value = (1U << *value) + bits;
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
      return BROTLI_DECODER_SUCCESS;

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}